

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

char * __thiscall cmGeneratorTarget::GetCustomObjectExtension(cmGeneratorTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  long lVar4;
  bool bVar5;
  string local_50;
  
  if ((GetCustomObjectExtension()::modes == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetCustomObjectExtension()::modes), iVar2 != 0)) {
    GetCustomObjectExtension::modes._M_elems[0].variable._M_dataplus._M_p =
         (pointer)&GetCustomObjectExtension::modes._M_elems[0].variable.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetCustomObjectExtension::modes,"CUDA_PTX_COMPILATION","");
    GetCustomObjectExtension::modes._M_elems[0].extension._M_dataplus._M_p =
         (pointer)&GetCustomObjectExtension::modes._M_elems[0].extension.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetCustomObjectExtension::modes._M_elems[0].extension,".ptx","");
    GetCustomObjectExtension::modes._M_elems[1].variable._M_dataplus._M_p =
         (pointer)&GetCustomObjectExtension::modes._M_elems[1].variable.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(GetCustomObjectExtension::modes._M_elems + 1),"CUDA_CUBIN_COMPILATION","")
    ;
    GetCustomObjectExtension::modes._M_elems[1].extension._M_dataplus._M_p =
         (pointer)&GetCustomObjectExtension::modes._M_elems[1].extension.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetCustomObjectExtension::modes._M_elems[1].extension,".cubin","");
    GetCustomObjectExtension::modes._M_elems[2].variable._M_dataplus._M_p =
         (pointer)&GetCustomObjectExtension::modes._M_elems[2].variable.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(GetCustomObjectExtension::modes._M_elems + 2),"CUDA_FATBIN_COMPILATION",""
              );
    GetCustomObjectExtension::modes._M_elems[2].extension._M_dataplus._M_p =
         (pointer)&GetCustomObjectExtension::modes._M_elems[2].extension.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetCustomObjectExtension::modes._M_elems[2].extension,".fatbin","");
    GetCustomObjectExtension::modes._M_elems[3].variable._M_dataplus._M_p =
         (pointer)&GetCustomObjectExtension::modes._M_elems[3].variable.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(GetCustomObjectExtension::modes._M_elems + 3),"CUDA_OPTIX_COMPILATION","")
    ;
    GetCustomObjectExtension::modes._M_elems[3].extension._M_dataplus._M_p =
         (pointer)&GetCustomObjectExtension::modes._M_elems[3].extension.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetCustomObjectExtension::modes._M_elems[3].extension,".optixir","");
    __cxa_atexit(std::array<compiler_mode,_4UL>::~array,&GetCustomObjectExtension::modes,
                 &__dso_handle);
    __cxa_guard_release(&GetCustomObjectExtension()::modes);
  }
  this_00 = this->Makefile;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_CUDA_COMPILER_ID","");
  psVar3 = cmMakefile::GetSafeDefinition(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (psVar3->_M_string_length != 0) {
    bVar5 = false;
    lVar4 = 0;
    do {
      bVar1 = cmTarget::GetPropertyAsBool
                        (this->Target,
                         (string *)
                         ((long)&GetCustomObjectExtension::modes._M_elems[0].variable._M_dataplus.
                                 _M_p + lVar4));
      if (bVar1) {
        psVar3 = *(string **)
                  ((long)&GetCustomObjectExtension::modes._M_elems[0].extension._M_dataplus._M_p +
                  lVar4);
        break;
      }
      lVar4 = lVar4 + 0x40;
      bVar5 = lVar4 == 0x100;
    } while (!bVar5);
    if (!bVar5) {
      return (char *)psVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* cmGeneratorTarget::GetCustomObjectExtension() const
{
  struct compiler_mode
  {
    std::string variable;
    std::string extension;
  };
  static std::array<compiler_mode, 4> const modes{
    { { "CUDA_PTX_COMPILATION", ".ptx" },
      { "CUDA_CUBIN_COMPILATION", ".cubin" },
      { "CUDA_FATBIN_COMPILATION", ".fatbin" },
      { "CUDA_OPTIX_COMPILATION", ".optixir" } }
  };

  std::string const& compiler =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_COMPILER_ID");
  if (!compiler.empty()) {
    for (const auto& m : modes) {
      const bool has_extension = this->GetPropertyAsBool(m.variable);
      if (has_extension) {
        return m.extension.c_str();
      }
    }
  }
  return nullptr;
}